

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.h
# Opt level: O0

WienerConvolveParams get_conv_params_wiener(int bd)

{
  WienerConvolveParams WVar1;
  int intbufrange;
  int bd_local;
  WienerConvolveParams conv_params;
  
  conv_params.round_0 = 3;
  conv_params.round_1 = 0xb;
  if (0x10 < bd + 6) {
    conv_params.round_0 = bd + -7;
    conv_params.round_1 = 0xb - (bd + -10);
  }
  WVar1.round_1 = conv_params.round_1;
  WVar1.round_0 = conv_params.round_0;
  return WVar1;
}

Assistant:

static inline WienerConvolveParams get_conv_params_wiener(int bd) {
  WienerConvolveParams conv_params;
  conv_params.round_0 = WIENER_ROUND0_BITS;
  conv_params.round_1 = 2 * FILTER_BITS - conv_params.round_0;
  const int intbufrange = bd + FILTER_BITS - conv_params.round_0 + 2;
  assert(IMPLIES(bd < 12, intbufrange <= 16));
  if (intbufrange > 16) {
    conv_params.round_0 += intbufrange - 16;
    conv_params.round_1 -= intbufrange - 16;
  }
  return conv_params;
}